

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void icu_63::parseRRULE(UnicodeString *rrule,int32_t *month,int32_t *dow,int32_t *wim,int32_t *dom,
                       int32_t *domCount,UDate *until,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int8_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  UChar *pUVar13;
  long lVar14;
  bool bVar15;
  UDate UVar16;
  UnicodeString value;
  UnicodeString attr;
  UnicodeString prop;
  int local_1a0;
  int local_190;
  UnicodeString local_188;
  int *local_148;
  int32_t *local_140;
  int *local_138;
  UnicodeString local_130;
  UnicodeString local_f0;
  int *local_b0;
  int32_t *local_a8;
  undefined1 *local_a0;
  UChar *local_90;
  undefined1 *local_80;
  undefined1 *local_70;
  undefined1 *local_60;
  undefined1 *local_50;
  undefined1 *local_40;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *month = -1;
    *dow = 0;
    local_1a0 = 0;
    *wim = 0;
    *until = -1.84303902528e+17;
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_130.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_130.fUnion.fStackFields.fLengthAndFlags = 2;
    local_188.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_188.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar2 = true;
    bVar3 = false;
    local_190 = 0;
    local_b0 = wim;
    local_a8 = dom;
    do {
      if (!bVar2) {
        if (!bVar3) goto LAB_002103c8;
        *domCount = local_190;
        goto LAB_002103d7;
      }
      if (local_1a0 < 0) {
        iVar12 = 0;
      }
      else {
        sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar12 = (rrule->fUnion).fFields.fLength;
        }
        else {
          iVar12 = (int)sVar1 >> 5;
        }
        if (local_1a0 <= iVar12) {
          iVar12 = local_1a0;
        }
      }
      sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar7 = (rrule->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar1 >> 5;
      }
      iVar5 = UnicodeString::doIndexOf(rrule,L';',iVar12,iVar7 - iVar12);
      if (iVar5 == -1) {
        UnicodeString::unBogus(&local_f0);
        if (local_1a0 < 0) {
          iVar5 = 0;
        }
        else {
          sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (rrule->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          if (local_1a0 <= iVar5) {
            iVar5 = local_1a0;
          }
        }
        uVar9 = local_f0.fUnion.fFields.fLength;
        if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (rrule->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        bVar2 = false;
        UnicodeString::doReplace(&local_f0,0,uVar9,rrule,iVar5,iVar6 - iVar5);
      }
      else {
        UnicodeString::unBogus(&local_f0);
        uVar9 = local_f0.fUnion.fFields.fLength;
        if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace(&local_f0,0,uVar9,rrule,local_1a0,iVar5 - local_1a0);
        local_1a0 = iVar5 + 1;
        bVar2 = true;
      }
      uVar9 = local_f0.fUnion.fFields.fLength;
      if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar5 = UnicodeString::doIndexOf(&local_f0,L'=',0,uVar9);
      bVar15 = true;
      if (iVar5 != -1) {
        UnicodeString::unBogus(&local_130);
        uVar9 = local_130.fUnion.fFields.fLength;
        if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace(&local_130,0,uVar9,&local_f0,0,iVar5);
        UnicodeString::unBogus(&local_188);
        iVar12 = 0;
        if (-2 < iVar5) {
          uVar9 = local_f0.fUnion.fFields.fLength;
          if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar12 = iVar5 + 1;
          if ((int)uVar9 < iVar5 + 1) {
            iVar12 = uVar9;
          }
        }
        uVar9 = local_188.fUnion.fFields.fLength;
        if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar10 = local_f0.fUnion.fFields.fLength;
        if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
          uVar10 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace(&local_188,0,uVar9,&local_f0,iVar12,uVar10 - iVar12);
        uVar9 = local_130.fUnion.fFields.fLength;
        if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar4 = UnicodeString::doCompare(&local_130,0,uVar9,(UChar *)ICAL_FREQ,0,-1);
        local_40 = ICAL_FREQ;
        if (iVar4 == '\0') {
          uVar9 = local_188.fUnion.fFields.fLength;
          if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar4 = UnicodeString::doCompare(&local_188,0,uVar9,(UChar *)ICAL_YEARLY,0,-1);
          local_a0 = ICAL_YEARLY;
          if (iVar4 == '\0') {
            bVar3 = true;
            goto LAB_002103a3;
          }
        }
        else {
          uVar9 = local_130.fUnion.fFields.fLength;
          if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar4 = UnicodeString::doCompare(&local_130,0,uVar9,(UChar *)ICAL_UNTIL,0,-1);
          local_50 = ICAL_UNTIL;
          if (iVar4 == '\0') {
            UVar16 = parseDateTimeString(&local_188,0,status);
            *until = UVar16;
LAB_0020ffe1:
            if (U_ZERO_ERROR < *status) goto LAB_002103a6;
          }
          else {
            uVar9 = local_130.fUnion.fFields.fLength;
            if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            iVar4 = UnicodeString::doCompare(&local_130,0,uVar9,(UChar *)ICAL_BYMONTH,0,-1);
            local_60 = ICAL_BYMONTH;
            if (iVar4 == '\0') {
              uVar9 = local_188.fUnion.fFields.fLength;
              if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
                uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if ((int)uVar9 < 3) {
                iVar5 = parseAsciiDigits(&local_188,0,uVar9,status);
                *month = iVar5 + -1;
                if (0xfffffff3 < iVar5 - 0xdU) goto LAB_0020ffe1;
              }
              goto LAB_002103a6;
            }
            uVar9 = local_130.fUnion.fFields.fLength;
            if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            iVar4 = UnicodeString::doCompare(&local_130,0,uVar9,(UChar *)ICAL_BYDAY,0,-1);
            local_70 = ICAL_BYDAY;
            if (iVar4 != '\0') {
              uVar9 = local_130.fUnion.fFields.fLength;
              if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
                uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              iVar4 = UnicodeString::doCompare(&local_130,0,uVar9,(UChar *)ICAL_BYMONTHDAY,0,-1);
              local_80 = ICAL_BYMONTHDAY;
              if (iVar4 == '\0') {
                lVar14 = 0;
                iVar12 = 0;
                local_148 = month;
                local_140 = dow;
                local_138 = domCount;
                bVar11 = false;
                do {
                  uVar9 = 0;
                  if (-1 < iVar12) {
                    uVar9 = local_188.fUnion.fFields.fLength;
                    if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
                      uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    if (iVar12 <= (int)uVar9) {
                      uVar9 = iVar12;
                    }
                  }
                  uVar10 = local_188.fUnion.fFields.fLength;
                  if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
                    uVar10 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  iVar5 = UnicodeString::doIndexOf(&local_188,L',',uVar9,uVar10 - uVar9);
                  bVar15 = iVar5 == -1;
                  uVar9 = iVar5;
                  if ((bVar15) &&
                     (uVar9 = local_188.fUnion.fFields.fLength,
                     -1 < local_188.fUnion.fStackFields.fLengthAndFlags)) {
                    uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  if (*local_138 <= lVar14) {
                    *status = U_BUFFER_OVERFLOW_ERROR;
LAB_00210370:
                    bVar15 = true;
                    goto LAB_00210376;
                  }
                  iVar6 = parseAsciiDigits(&local_188,iVar12,uVar9 - iVar12,status);
                  local_a8[lVar14] = iVar6;
                  if (U_ZERO_ERROR < *status) goto LAB_00210370;
                  lVar14 = lVar14 + 1;
                  iVar12 = uVar9 + 1;
                  bVar11 = bVar15;
                } while (iVar5 != -1);
                bVar15 = false;
                local_190 = (int)lVar14;
LAB_00210376:
                dow = local_140;
                domCount = local_138;
                month = local_148;
                if (!bVar11) goto LAB_002103a6;
              }
              goto LAB_002103a3;
            }
            uVar9 = local_188.fUnion.fFields.fLength;
            if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (uVar9 - 5 < 0xfffffffd) {
LAB_0021035a:
              bVar15 = true;
            }
            else {
              if ((int)uVar9 < 3) {
LAB_0021030c:
                lVar14 = -7;
                pUVar13 = (UChar *)ICAL_DOW_NAMES;
                do {
                  uVar9 = local_188.fUnion.fFields.fLength;
                  if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
                    uVar9 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  iVar4 = UnicodeString::doCompare(&local_188,0,uVar9,pUVar13,0,2);
                  local_90 = pUVar13;
                  if (iVar4 == '\0') {
                    *dow = (int)lVar14 + 8;
                    bVar15 = false;
                    goto LAB_0021039e;
                  }
                  lVar14 = lVar14 + 1;
                  pUVar13 = pUVar13 + 3;
                } while (lVar14 != 0);
                goto LAB_0021035a;
              }
              local_148 = month;
              uVar8 = local_188.fUnion.fStackFields.fBuffer;
              if (((int)local_188.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                uVar8 = local_188.fUnion.fFields.fArray;
              }
              iVar12 = 1;
              local_140 = dow;
              if (*(char16_t *)uVar8 == L'+') {
LAB_0021029f:
                iVar5 = parseAsciiDigits(&local_188,uVar9 + -3,1,status);
                bVar11 = false;
                bVar15 = true;
                if ((iVar5 < 5) && ((iVar5 != 0 && (*status < U_ILLEGAL_ARGUMENT_ERROR)))) {
                  *local_b0 = iVar5 * iVar12;
                  bVar15 = false;
                  bVar11 = true;
                  UnicodeString::doReplace(&local_188,0,uVar9 + -2,(UChar *)0x0,0,0);
                }
              }
              else {
                uVar8 = local_188.fUnion.fStackFields.fBuffer;
                if ((local_188.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                  uVar8 = local_188.fUnion.fFields.fArray;
                }
                iVar12 = -1;
                if ((*(char16_t *)uVar8 == L'-') || (iVar12 = 1, uVar9 != 4)) goto LAB_0021029f;
                bVar15 = true;
                bVar11 = false;
              }
              dow = local_140;
              month = local_148;
              if (bVar11) goto LAB_0021030c;
            }
LAB_0021039e:
            if (bVar15) goto LAB_002103a6;
          }
LAB_002103a3:
          bVar15 = false;
        }
      }
LAB_002103a6:
    } while (!bVar15);
    if (bVar15) {
LAB_002103c8:
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
LAB_002103d7:
    UnicodeString::~UnicodeString(&local_188);
    UnicodeString::~UnicodeString(&local_130);
    UnicodeString::~UnicodeString(&local_f0);
  }
  return;
}

Assistant:

static void parseRRULE(const UnicodeString& rrule, int32_t& month, int32_t& dow, int32_t& wim,
                       int32_t* dom, int32_t& domCount, UDate& until, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    int32_t numDom = 0;

    month = -1;
    dow = 0;
    wim = 0;
    until = MIN_MILLIS;

    UBool yearly = FALSE;
    //UBool parseError = FALSE;

    int32_t prop_start = 0;
    int32_t prop_end;
    UnicodeString prop, attr, value;
    UBool nextProp = TRUE;

    while (nextProp) {
        prop_end = rrule.indexOf(SEMICOLON, prop_start);
        if (prop_end == -1) {
            prop.setTo(rrule, prop_start);
            nextProp = FALSE;
        } else {
            prop.setTo(rrule, prop_start, prop_end - prop_start);
            prop_start = prop_end + 1;
        }
        int32_t eql = prop.indexOf(EQUALS_SIGN);
        if (eql != -1) {
            attr.setTo(prop, 0, eql);
            value.setTo(prop, eql + 1);
        } else {
            goto rruleParseError;
        }

        if (attr.compare(ICAL_FREQ, -1) == 0) {
            // only support YEARLY frequency type
            if (value.compare(ICAL_YEARLY, -1) == 0) {
                yearly = TRUE;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_UNTIL, -1) == 0) {
            // ISO8601 UTC format, for example, "20060315T020000Z"
            until = parseDateTimeString(value, 0, status);
            if (U_FAILURE(status)) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTH, -1) == 0) {
            // Note: BYMONTH may contain multiple months, but only single month make sense for
            // VTIMEZONE property.
            if (value.length() > 2) {
                goto rruleParseError;
            }
            month = parseAsciiDigits(value, 0, value.length(), status) - 1;
            if (U_FAILURE(status) || month < 0 || month >= 12) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYDAY, -1) == 0) {
            // Note: BYDAY may contain multiple day of week separated by comma.  It is unlikely used for
            // VTIMEZONE property.  We do not support the case.

            // 2-letter format is used just for representing a day of week, for example, "SU" for Sunday
            // 3 or 4-letter format is used for represeinging Nth day of week, for example, "-1SA" for last Saturday
            int32_t length = value.length();
            if (length < 2 || length > 4) {
                goto rruleParseError;
            }
            if (length > 2) {
                // Nth day of week
                int32_t sign = 1;
                if (value.charAt(0) == PLUS) {
                    sign = 1;
                } else if (value.charAt(0) == MINUS) {
                    sign = -1;
                } else if (length == 4) {
                    goto rruleParseError;
                }
                int32_t n = parseAsciiDigits(value, length - 3, 1, status);
                if (U_FAILURE(status) || n == 0 || n > 4) {
                    goto rruleParseError;
                }
                wim = n * sign;
                value.remove(0, length - 2);
            }
            int32_t wday;
            for (wday = 0; wday < 7; wday++) {
                if (value.compare(ICAL_DOW_NAMES[wday], 2) == 0) {
                    break;
                }
            }
            if (wday < 7) {
                // Sunday(1) - Saturday(7)
                dow = wday + 1;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTHDAY, -1) == 0) {
            // Note: BYMONTHDAY may contain multiple days delimitted by comma
            //
            // A value of BYMONTHDAY could be negative, for example, -1 means
            // the last day in a month
            int32_t dom_idx = 0;
            int32_t dom_start = 0;
            int32_t dom_end;
            UBool nextDOM = TRUE;
            while (nextDOM) {
                dom_end = value.indexOf(COMMA, dom_start);
                if (dom_end == -1) {
                    dom_end = value.length();
                    nextDOM = FALSE;
                }
                if (dom_idx < domCount) {
                    dom[dom_idx] = parseAsciiDigits(value, dom_start, dom_end - dom_start, status);
                    if (U_FAILURE(status)) {
                        goto rruleParseError;
                    }
                    dom_idx++;
                } else {
                    status = U_BUFFER_OVERFLOW_ERROR;
                    goto rruleParseError;
                }
                dom_start = dom_end + 1;
            }
            numDom = dom_idx;
        }
    }
    if (!yearly) {
        // FREQ=YEARLY must be set
        goto rruleParseError;
    }
    // Set actual number of parsed DOM (ICAL_BYMONTHDAY)
    domCount = numDom;
    return;

rruleParseError:
    if (U_SUCCESS(status)) {
        // Set error status
        status = U_INVALID_FORMAT_ERROR;
    }
}